

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdnslookup.cpp
# Opt level: O1

void __thiscall
QDnsLookup::QDnsLookup
          (QDnsLookup *this,Type type,QString *name,Protocol protocol,QHostAddress *nameserver,
          quint16 port,QObject *parent)

{
  long lVar1;
  QDnsLookupPrivate *this_00;
  
  this_00 = (QDnsLookupPrivate *)operator_new(0x1b0);
  QDnsLookupPrivate::QDnsLookupPrivate(this_00);
  QObject::QObject(&this->super_QObject,(QObjectPrivate *)this_00,parent);
  *(undefined ***)this = &PTR_metaObject_002d4c08;
  lVar1 = *(long *)&this->field_0x8;
  QObjectBindableProperty<QDnsLookupPrivate,_QString,_&QDnsLookupPrivate::_qt_property_name_offset,_&QDnsLookupPrivate::nameChanged>
  ::setValue((QObjectBindableProperty<QDnsLookupPrivate,_QString,_&QDnsLookupPrivate::_qt_property_name_offset,_&QDnsLookupPrivate::nameChanged>
              *)(lVar1 + 0x78),name);
  QObjectBindableProperty<QDnsLookupPrivate,_QDnsLookup::Type,_&QDnsLookupPrivate::_qt_property_type_offset,_&QDnsLookupPrivate::typeChanged>
  ::setValue((QObjectBindableProperty<QDnsLookupPrivate,_QDnsLookup::Type,_&QDnsLookupPrivate::_qt_property_type_offset,_&QDnsLookupPrivate::typeChanged>
              *)(lVar1 + 0x98),type);
  QObjectBindableProperty<QDnsLookupPrivate,_QHostAddress,_&QDnsLookupPrivate::_qt_property_nameserver_offset,_&QDnsLookupPrivate::nameserverChanged>
  ::setValue((QObjectBindableProperty<QDnsLookupPrivate,_QHostAddress,_&QDnsLookupPrivate::_qt_property_nameserver_offset,_&QDnsLookupPrivate::nameserverChanged>
              *)(lVar1 + 0x90),nameserver);
  QObjectBindableProperty<QDnsLookupPrivate,_unsigned_short,_&QDnsLookupPrivate::_qt_property_port_offset,_&QDnsLookupPrivate::nameserverPortChanged>
  ::setValue((QObjectBindableProperty<QDnsLookupPrivate,_unsigned_short,_&QDnsLookupPrivate::_qt_property_port_offset,_&QDnsLookupPrivate::nameserverPortChanged>
              *)(lVar1 + 0x9c),port);
  QObjectBindableProperty<QDnsLookupPrivate,_QDnsLookup::Protocol,_&QDnsLookupPrivate::_qt_property_protocol_offset,_&QDnsLookupPrivate::nameserverProtocolChanged>
  ::setValue((QObjectBindableProperty<QDnsLookupPrivate,_QDnsLookup::Protocol,_&QDnsLookupPrivate::_qt_property_protocol_offset,_&QDnsLookupPrivate::nameserverProtocolChanged>
              *)(lVar1 + 0x9e),protocol);
  return;
}

Assistant:

QDnsLookup::QDnsLookup(Type type, const QString &name, Protocol protocol,
                       const QHostAddress &nameserver, quint16 port, QObject *parent)
    : QObject(*new QDnsLookupPrivate, parent)
{
    Q_D(QDnsLookup);
    d->name = name;
    d->type = type;
    d->nameserver = nameserver;
    d->port = port;
    d->protocol = protocol;
}